

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

vm_obj_id_t CVmObjDate::create_from_stack(uchar **pc_ptr,uint argc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  char *pcVar3;
  vm_val_t *pvVar4;
  CVmObject *pCVar5;
  vm_date_ext *pvVar6;
  size_t sVar7;
  uint in_ESI;
  double dVar8;
  vm_obj_id_t id;
  bignum_t<32> bdayno;
  double d;
  double dms;
  double dn;
  gregcaldate_t cal;
  CVmDateLocale lc;
  CVmObjDate *refdate;
  int32_t reftime;
  int32_t refday;
  CVmTimeZone *reftz;
  char *str;
  int32_t daytime;
  int32_t dayno;
  CVmTimeZoneCache *in_stack_00000198;
  multicaldate_t *in_stack_000002b0;
  CVmDateLocale *in_stack_000002b8;
  vm_val_t *in_stack_000002c0;
  char *in_stack_000002c8;
  int32_t *in_stack_000002d0;
  int32_t *in_stack_000002d8;
  int32_t in_stack_000002f0;
  int32_t in_stack_000002f8;
  CVmTimeZone *in_stack_00000300;
  date_parse_result *in_stack_00000308;
  date_parse_string *in_stack_00000310;
  int *in_stack_00000318;
  undefined4 in_stack_fffffffffffffed8;
  vm_obj_id_t in_stack_fffffffffffffedc;
  int32_t in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  CVmTimeZone *in_stack_fffffffffffffee8;
  gregcaldate_t *in_stack_fffffffffffffef0;
  int32_t *in_stack_fffffffffffffef8;
  CVmTimeZone *in_stack_ffffffffffffff00;
  double in_stack_ffffffffffffff08;
  bignum_t<32> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff20;
  double local_80;
  int32_t local_30;
  CVmTimeZone *local_28;
  
  if (in_ESI == 0) {
    caldate_t::now((int32_t *)in_stack_fffffffffffffef0,(int32_t *)in_stack_fffffffffffffee8);
    goto LAB_002f08d7;
  }
  if ((in_ESI != 0) && (in_ESI < 4)) {
    CVmStack::get(0);
    pcVar3 = vm_val_t::get_as_string
                       ((vm_val_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    if (pcVar3 != (char *)0x0) {
      if ((in_ESI < 2) || (pvVar4 = CVmStack::get(1), pvVar4->typ == VM_NIL)) {
        local_28 = CVmTimeZoneCache::get_local_zone(in_stack_00000198);
      }
      else {
        local_28 = get_tz_arg((uint)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                              (uint)in_stack_fffffffffffffee8);
      }
      if ((in_ESI < 3) || (pvVar4 = CVmStack::get(2), pvVar4->typ == VM_NIL)) {
        caldate_t::now((int32_t *)in_stack_fffffffffffffef0,(int32_t *)in_stack_fffffffffffffee8);
      }
      else {
        pvVar4 = CVmStack::get(2);
        if (pvVar4->typ == VM_OBJ) {
          CVmStack::get(2);
          pCVar5 = vm_objp(0);
          iVar1 = (*pCVar5->_vptr_CVmObject[1])(pCVar5,metaclass_reg_);
          if (iVar1 == 0) goto LAB_002f02d4;
          CVmStack::get(2);
          pCVar5 = vm_objp(0);
        }
        else {
LAB_002f02d4:
          pCVar5 = (CVmObject *)0x0;
        }
        if (pCVar5 == (CVmObject *)0x0) {
          err_throw(0);
        }
        get_ext((CVmObjDate *)pCVar5);
        pvVar6 = get_ext((CVmObjDate *)pCVar5);
        local_30 = pvVar6->daytime;
      }
      CVmDateLocale::CVmDateLocale((CVmDateLocale *)in_stack_ffffffffffffff00);
      gregcaldate_t::gregcaldate_t(in_stack_fffffffffffffef0);
      in_stack_fffffffffffffef0 = (gregcaldate_t *)0x0;
      iVar1 = parse_date_string(in_stack_000002d8,in_stack_000002d0,in_stack_000002c8,
                                in_stack_000002c0,in_stack_000002b8,in_stack_000002b0,
                                in_stack_000002f0,in_stack_000002f8,in_stack_00000300,
                                in_stack_00000308,in_stack_00000310,in_stack_00000318);
      if (iVar1 == 0) {
        err_throw(0);
      }
      gregcaldate_t::~gregcaldate_t((gregcaldate_t *)0x2f041a);
      in_stack_fffffffffffffee0 = local_30;
      in_stack_fffffffffffffee8 = local_28;
      goto LAB_002f08d7;
    }
  }
  if (in_ESI == 2) {
    CVmStack::get(0);
    iVar1 = vm_val_t::is_numeric
                      ((vm_val_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    if (iVar1 != 0) {
      CVmStack::get(1);
      pcVar3 = vm_val_t::get_as_string
                         ((vm_val_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
      ;
      if (pcVar3 != (char *)0x0) {
        sVar7 = vmb_get_len((char *)0x2f0478);
        if ((sVar7 == 1) && ((pcVar3[2] == 'U' || (pcVar3[2] == 'u')))) {
          CVmStack::get(0);
          dVar8 = vm_val_t::num_to_double
                            ((vm_val_t *)
                             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
          local_80 = floor(dVar8 / 86400.0);
          local_80 = local_80 + 719468.0;
        }
        else {
          sVar7 = vmb_get_len((char *)0x2f055f);
          if ((sVar7 != 1) || ((pcVar3[2] != 'J' && (pcVar3[2] != 'j')))) {
            err_throw(0);
          }
          CVmStack::get(0);
          bignum_t<32>::bignum_t
                    ((bignum_t<32> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     (vm_val_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          bignum_t<32>::operator-=
                    ((bignum_t<32> *)in_stack_ffffffffffffff00,(double)in_stack_fffffffffffffef8);
          dVar8 = bignum_t::operator_cast_to_double((bignum_t<32> *)0x2f05ca);
          local_80 = floor(dVar8);
          bignum_t<32>::operator-(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          bignum_t<32>::operator*(in_stack_ffffffffffffff10,(long)in_stack_ffffffffffffff08);
          bignum_t::operator_cast_to_double((bignum_t<32> *)0x2f0611);
        }
        if ((2147483647.0 < local_80) || (local_80 < -2147483648.0)) {
          err_throw(0);
        }
        round_int32((double)in_stack_fffffffffffffef0);
        goto LAB_002f08d7;
      }
    }
  }
  if ((in_ESI == 3) || (in_ESI == 7)) {
    CVmStack::get(0);
    iVar1 = vm_val_t::is_numeric
                      ((vm_val_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    if (iVar1 != 0) {
      CVmStack::get(1);
      iVar1 = vm_val_t::is_numeric
                        ((vm_val_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      if (iVar1 != 0) {
        CVmStack::get(2);
        iVar1 = vm_val_t::is_numeric
                          ((vm_val_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
                          );
        if (iVar1 != 0) {
          if (in_ESI == 3) {
LAB_002f0758:
            parse_ymd_args((int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                           (int)in_stack_ffffffffffffff20,
                           (int32_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                           (int32_t *)in_stack_ffffffffffffff10);
            CVmTimeZoneCache::get_local_zone(in_stack_00000198);
            CVmTimeZone::local_to_utc
                      (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                       (int32_t *)in_stack_fffffffffffffef0);
            goto LAB_002f08d7;
          }
          CVmStack::get(3);
          iVar1 = vm_val_t::is_numeric
                            ((vm_val_t *)
                             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
          if (iVar1 != 0) {
            CVmStack::get(4);
            iVar1 = vm_val_t::is_numeric
                              ((vm_val_t *)
                               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
            if (iVar1 != 0) {
              CVmStack::get(5);
              iVar1 = vm_val_t::is_numeric
                                ((vm_val_t *)
                                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
              if (iVar1 != 0) {
                CVmStack::get(6);
                iVar1 = vm_val_t::is_numeric
                                  ((vm_val_t *)
                                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
                if (iVar1 != 0) goto LAB_002f0758;
              }
            }
          }
        }
      }
    }
  }
  if ((in_ESI == 4) || (in_ESI == 8)) {
    CVmStack::get(0);
    iVar1 = vm_val_t::is_numeric
                      ((vm_val_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    if (iVar1 != 0) {
      CVmStack::get(1);
      iVar1 = vm_val_t::is_numeric
                        ((vm_val_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      if (iVar1 != 0) {
        CVmStack::get(2);
        iVar1 = vm_val_t::is_numeric
                          ((vm_val_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
                          );
        if (iVar1 != 0) {
          if (in_ESI != 4) {
            CVmStack::get(3);
            iVar1 = vm_val_t::is_numeric
                              ((vm_val_t *)
                               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
            if (iVar1 == 0) goto LAB_002f08c5;
            CVmStack::get(4);
            iVar1 = vm_val_t::is_numeric
                              ((vm_val_t *)
                               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
            if (iVar1 == 0) goto LAB_002f08c5;
            CVmStack::get(5);
            iVar1 = vm_val_t::is_numeric
                              ((vm_val_t *)
                               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
            if (iVar1 == 0) goto LAB_002f08c5;
            CVmStack::get(6);
            iVar1 = vm_val_t::is_numeric
                              ((vm_val_t *)
                               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
            if (iVar1 == 0) goto LAB_002f08c5;
          }
          parse_ymd_args((int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                         (int)in_stack_ffffffffffffff20,
                         (int32_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                         (int32_t *)in_stack_ffffffffffffff10);
          get_tz_arg((uint)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                     (uint)in_stack_fffffffffffffee8);
          CVmTimeZone::local_to_utc
                    (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                     (int32_t *)in_stack_fffffffffffffef0);
LAB_002f08d7:
          vVar2 = vm_new_id(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,
                            in_stack_fffffffffffffedc);
          CVmObject::operator_new
                    (CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     in_stack_fffffffffffffedc);
          CVmObjDate((CVmObjDate *)in_stack_fffffffffffffef0,
                     (int32_t)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                     (uint32_t)in_stack_fffffffffffffee8);
          CVmStack::discard(in_ESI);
          return vVar2;
        }
      }
    }
  }
LAB_002f08c5:
  err_throw(0);
}

Assistant:

vm_obj_id_t CVmObjDate::create_from_stack(VMG_ const uchar **pc_ptr, uint argc)
{
    int32_t dayno;
    int32_t daytime;
    const char *str;
    
    /* check for the various argument lists */
    if (argc == 0)
    {
        /* no arguments - get the current date and time in the local zone */
        caldate_t::now(dayno, daytime);
    }
    else if ((argc >= 1 && argc <= 3)
             && (str = G_stk->get(0)->get_as_string(vmg0_)) != 0)
    {
        /* 
         *   The first argument is a date in string format.  The optional
         *   second argument is the reference time zone; the optional third
         *   argument is the reference date.
         */

        /* get the reference time zone */
        CVmTimeZone *reftz;
        if (argc >= 2 && G_stk->get(1)->typ != VM_NIL)
            reftz = get_tz_arg(vmg_ 1, argc);
        else
            reftz = G_tzcache->get_local_zone(vmg0_);

        /* get the reference date */
        int32_t refday, reftime;
        if (argc >= 3 && G_stk->get(2)->typ != VM_NIL)
        {
            /* get the reference Date object */
            CVmObjDate *refdate = vm_val_cast(CVmObjDate, G_stk->get(2));
            if (refdate == 0)
                err_throw(VMERR_BAD_TYPE_BIF);

            /* take the reference point from the Date object */
            refday = refdate->get_ext()->dayno;
            reftime = refdate->get_ext()->daytime;
        }
        else
        {
            /* no reference date, so use the current time */
            caldate_t::now(refday, reftime);
        }

        /* parse the format */
        CVmDateLocale lc Pvmg0_P;
        gregcaldate_t cal;
        if (!parse_date_string(vmg_ dayno, daytime, str, 0, &lc, &cal,
                               refday, reftime, reftz, 0, 0, 0))
            err_throw(VMERR_BAD_VAL_BIF);
    }
    else if (argc == 2
             && G_stk->get(0)->is_numeric(vmg0_)
             && (str = G_stk->get(1)->get_as_string(vmg0_)) != 0)
    {
        /* check the type code */
        double dn, dms;
        if (vmb_get_len(str) == 1 && (str[2] == 'U' || str[2] == 'u'))
        {
            /* 
             *   'U' - Unix time, as seconds past 1/1/1970, UTC.  Get the
             *   argument as a double, and convert it to our day numbering
             *   scheme by dividing by seconds per day and adding the Unix
             *   Epoch's day number.  (An ordinary double is big enough to
             *   hold the largest Unix seconds-since-Epoch value we can
             *   represent: our range is limited by the 32-bit day number, so
             *   in terms of seconds that's (2^31-1)*86400, which needs about
             *   49 bits.  A standard double's mantissa is 52 bits, so it can
             *   represent any integer in our range exactly.)
             */
            double d = G_stk->get(0)->num_to_double(vmg0_);
            dn = floor(d / (24*60*60));
            dms = (d - (dn * (24*60*60))) * 1000;
            dn += caldate_t::UNIX_EPOCH_DAYNO;
        }
        else if (vmb_get_len(str) == 1 && (str[2] == 'J' || str[2] == 'j'))
        {
            /* 
             *   'J' - Julian day number; get the value, and adjust it to our
             *   Epoch by subtracting the Julian day number of our Epoch.
             *   The whole part is our day number; the fractional part is the
             *   fraction of a day past midnight (the .5 in the Epoch
             *   adjustment recalibrates from noon to midnight).
             */
            bignum_t<32> bdayno(vmg_ G_stk->get(0));
            bdayno -= 1721119.5;
            dn = floor((double)bdayno);
            dms = (double)((bdayno - dn) * (long)(24*60*60*1000));
        }
        else
        {
            /* unrecognized code */
            err_throw(VMERR_BAD_VAL_BIF);
        }

        /* make sure the day number fits an int32 */
        if (dn > INT32MAXVAL || dn < INT32MINVAL)
            err_throw(VMERR_NUM_OVERFLOW);
        dayno = (int32_t)dn;
        
        /* convert milliseconds to int32 */
        daytime = round_int32(dms);
    }
    else if ((argc == 3 || argc == 7)
             && G_stk->get(0)->is_numeric(vmg0_)
             && G_stk->get(1)->is_numeric(vmg0_)
             && G_stk->get(2)->is_numeric(vmg0_)
             && (argc == 3
                 || (G_stk->get(3)->is_numeric(vmg0_)
                     && G_stk->get(4)->is_numeric(vmg0_)
                     && G_stk->get(5)->is_numeric(vmg0_)
                     && G_stk->get(6)->is_numeric(vmg0_))))
    {
        /* parse the Y/M/D or Y/M/D HH:MI:SS arguments */
        parse_ymd_args(vmg_ 0, argc, dayno, daytime);

        /* convert from the local time zone to UTC */
        G_tzcache->get_local_zone(vmg0_)->local_to_utc(dayno, daytime);
    }
    else if ((argc == 4 || argc == 8)
             && G_stk->get(0)->is_numeric(vmg0_)
             && G_stk->get(1)->is_numeric(vmg0_)
             && G_stk->get(2)->is_numeric(vmg0_)
             && (argc == 4
                 || (G_stk->get(3)->is_numeric(vmg0_)
                     && G_stk->get(4)->is_numeric(vmg0_)
                     && G_stk->get(5)->is_numeric(vmg0_)
                     && G_stk->get(6)->is_numeric(vmg0_))))
    {
        /* parse the Y/M/D or Y/M/D HH:MI:SS arguments */
        parse_ymd_args(vmg_ 0, argc - 1, dayno, daytime);

        /* convert from the given time zone to UTC */
        get_tz_arg(vmg_ argc - 1, argc)->local_to_utc(dayno, daytime);
    }
    else
    {
        /* wrong arguments */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* create the object */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
    new (vmg_ id) CVmObjDate(vmg_ dayno, daytime);

    /* discard arguments */
    G_stk->discard(argc);

    /* return the new ID */
    return id;
}